

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::logMeasurementInfo
          (ShaderPerformanceMeasurer *this,TestLog *log)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint64 dVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  undefined1 auVar9 [16];
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  long local_290;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  double local_1e8;
  double dStack_1e0;
  LogNumber<float> local_1d0;
  LogNumber<float> local_168;
  LogNumber<float> local_100;
  LogNumber<float> local_98;
  
  dVar5 = MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
  iVar1 = (this->m_calibrator).m_measureState.numDrawCalls;
  iVar8 = (int)((ulong)((long)(this->m_calibrator).m_measureState.frameTimes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_calibrator).m_measureState.frameTimes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_290 = (long)this->m_viewportWidth;
  iVar2 = this->m_viewportHeight;
  iVar3 = this->m_gridSizeX;
  iVar4 = this->m_gridSizeY;
  logCalibrationInfo(log,&this->m_calibrator);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"FramesPerSecond","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,"Frames per second in measurement","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Frames/s","");
  auVar9._8_4_ = (int)(dVar5 >> 0x20);
  auVar9._0_8_ = dVar5;
  auVar9._12_4_ = 0x45300000;
  dStack_1e0 = auVar9._8_8_ - 1.9342813113834067e+25;
  local_1e8 = dStack_1e0 + ((double)CONCAT44(0x43300000,(int)dVar5) - 4503599627370496.0);
  tcu::LogNumber<float>::LogNumber
            (&local_98,&local_2b0,&local_2d0,&local_2f0,QP_KEY_TAG_PERFORMANCE,
             (float)((double)iVar8 / (local_1e8 / 1000000.0)));
  tcu::TestLog::writeFloat
            (log,local_98.m_name._M_dataplus._M_p,local_98.m_desc._M_dataplus._M_p,
             local_98.m_unit._M_dataplus._M_p,local_98.m_tag,local_98.m_value);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"FragmentsPerVertices","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Vertex-fragment ratio","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Fragments/Vertices","");
  lVar6 = (long)(iVar1 * iVar8);
  lVar7 = iVar2 * local_290 * lVar6;
  lVar6 = ((iVar4 + 1) * (iVar3 + 1)) * lVar6;
  tcu::LogNumber<float>::LogNumber
            (&local_100,&local_310,&local_330,&local_350,QP_KEY_TAG_NONE,(float)lVar7 / (float)lVar6
            );
  tcu::TestLog::writeFloat
            (log,local_100.m_name._M_dataplus._M_p,local_100.m_desc._M_dataplus._M_p,
             local_100.m_unit._M_dataplus._M_p,local_100.m_tag,local_100.m_value);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"FragmentPerf","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Fragment performance","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"MPix/s","");
  tcu::LogNumber<float>::LogNumber
            (&local_168,&local_370,&local_208,&local_228,QP_KEY_TAG_PERFORMANCE,
             (float)((double)lVar7 / local_1e8));
  tcu::TestLog::writeFloat
            (log,local_168.m_name._M_dataplus._M_p,local_168.m_desc._M_dataplus._M_p,
             local_168.m_unit._M_dataplus._M_p,local_168.m_tag,local_168.m_value);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"VertexPerf","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Vertex performance","");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MVert/s","");
  tcu::LogNumber<float>::LogNumber
            (&local_1d0,&local_248,&local_268,&local_288,QP_KEY_TAG_PERFORMANCE,
             (float)((double)lVar6 / local_1e8));
  tcu::TestLog::writeFloat
            (log,local_1d0.m_name._M_dataplus._M_p,local_1d0.m_desc._M_dataplus._M_p,
             local_1d0.m_unit._M_dataplus._M_p,local_1d0.m_tag,local_1d0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_unit._M_dataplus._M_p != &local_1d0.m_unit.field_2) {
    operator_delete(local_1d0.m_unit._M_dataplus._M_p,
                    local_1d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_desc._M_dataplus._M_p != &local_1d0.m_desc.field_2) {
    operator_delete(local_1d0.m_desc._M_dataplus._M_p,
                    local_1d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_name._M_dataplus._M_p != &local_1d0.m_name.field_2) {
    operator_delete(local_1d0.m_name._M_dataplus._M_p,
                    local_1d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_unit._M_dataplus._M_p != &local_168.m_unit.field_2) {
    operator_delete(local_168.m_unit._M_dataplus._M_p,
                    local_168.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_desc._M_dataplus._M_p != &local_168.m_desc.field_2) {
    operator_delete(local_168.m_desc._M_dataplus._M_p,
                    local_168.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_name._M_dataplus._M_p != &local_168.m_name.field_2) {
    operator_delete(local_168.m_name._M_dataplus._M_p,
                    local_168.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_unit._M_dataplus._M_p != &local_100.m_unit.field_2) {
    operator_delete(local_100.m_unit._M_dataplus._M_p,
                    local_100.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_desc._M_dataplus._M_p != &local_100.m_desc.field_2) {
    operator_delete(local_100.m_desc._M_dataplus._M_p,
                    local_100.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_name._M_dataplus._M_p != &local_100.m_name.field_2) {
    operator_delete(local_100.m_name._M_dataplus._M_p,
                    local_100.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_unit._M_dataplus._M_p != &local_98.m_unit.field_2) {
    operator_delete(local_98.m_unit._M_dataplus._M_p,
                    local_98.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_desc._M_dataplus._M_p != &local_98.m_desc.field_2) {
    operator_delete(local_98.m_desc._M_dataplus._M_p,
                    local_98.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_name._M_dataplus._M_p != &local_98.m_name.field_2) {
    operator_delete(local_98.m_name._M_dataplus._M_p,
                    local_98.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ShaderPerformanceMeasurer::logMeasurementInfo (TestLog& log) const
{
	DE_ASSERT(m_state == STATE_FINISHED);

	const MeasureState& measureState(m_calibrator.getMeasureState());

	// Compute totals.
	deUint64	totalTime			= measureState.getTotalTime();
	int			numFrames			= (int)measureState.frameTimes.size();
	deInt64		numQuadGrids		= measureState.numDrawCalls * numFrames;
	deInt64		numPixels			= (deInt64)m_viewportWidth * (deInt64)m_viewportHeight * numQuadGrids;
	deInt64		numVertices			= (deInt64)getNumVertices(m_gridSizeX, m_gridSizeY) * numQuadGrids;
	double		mfragPerSecond		= (double)numPixels / (double)totalTime;
	double		mvertPerSecond		= (double)numVertices / (double)totalTime;
	double		framesPerSecond		= (double)numFrames / ((double)totalTime / 1000000.0);

	logCalibrationInfo(log, m_calibrator);

	log << TestLog::Float("FramesPerSecond",		"Frames per second in measurement",	"Frames/s",				QP_KEY_TAG_PERFORMANCE,	(float)framesPerSecond)
		<< TestLog::Float("FragmentsPerVertices",	"Vertex-fragment ratio",			"Fragments/Vertices",	QP_KEY_TAG_NONE,		(float)numPixels / (float)numVertices)
		<< TestLog::Float("FragmentPerf",			"Fragment performance",				"MPix/s",				QP_KEY_TAG_PERFORMANCE, (float)mfragPerSecond)
		<< TestLog::Float("VertexPerf",				"Vertex performance",				"MVert/s",				QP_KEY_TAG_PERFORMANCE, (float)mvertPerSecond);
}